

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int nghttp2_submit_response
              (nghttp2_session *session,int32_t stream_id,nghttp2_nv *nva,size_t nvlen,
              nghttp2_data_provider *data_prd)

{
  int32_t iVar1;
  uint8_t flags;
  
  if (stream_id < 1) {
    return -0x1f5;
  }
  if (session->server != '\0') {
    if ((data_prd == (nghttp2_data_provider *)0x0) ||
       (data_prd->read_callback == (nghttp2_data_source_read_callback)0x0)) {
      flags = '\x01';
    }
    else {
      flags = '\0';
    }
    iVar1 = submit_headers_shared_nva
                      (session,flags,stream_id,(nghttp2_priority_spec *)0x0,nva,nvlen,data_prd,
                       (void *)0x0);
    return iVar1;
  }
  return -0x1f9;
}

Assistant:

int nghttp2_submit_response(nghttp2_session *session, int32_t stream_id,
                            const nghttp2_nv *nva, size_t nvlen,
                            const nghttp2_data_provider *data_prd) {
  uint8_t flags;

  if (stream_id <= 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  flags = set_response_flags(data_prd);
  return submit_headers_shared_nva(session, flags, stream_id, NULL, nva, nvlen,
                                   data_prd, NULL);
}